

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void dxil_spv::Converter::Impl::get_shader_model
               (Module *module,String *model,uint32_t *major,uint32_t *minor)

{
  uint uVar1;
  NamedMDNode *this;
  MDNode *node;
  ThreadLocalAllocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_48;
  
  uVar1 = (uint)minor;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&local_48,"dx.shaderModel",&local_49);
  this = LLVMBC::Module::getNamedMetadata(module,&local_48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  _M_dispose(&local_48);
  if (this == (NamedMDNode *)0x0) {
    if (major != (uint32_t *)0x0) {
      *major = 6;
    }
    if (minor != (uint32_t *)0x0) {
      *minor = 0;
    }
    if (model != (String *)0x0) {
      model->_M_string_length = 0;
      *(model->_M_dataplus)._M_p = '\0';
    }
  }
  else {
    node = LLVMBC::NamedMDNode::getOperand(this,0);
    if (model != (String *)0x0) {
      get_string_metadata_abi_cxx11_(&local_48,(dxil_spv *)node,(MDNode *)0x0,uVar1);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::operator=
                (model,&local_48);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                (&local_48);
    }
    if (major != (uint32_t *)0x0) {
      uVar1 = get_constant_metadata<unsigned_int>(node,1);
      *major = uVar1;
    }
    if (minor != (uint32_t *)0x0) {
      uVar1 = get_constant_metadata<unsigned_int>(node,2);
      *minor = uVar1;
    }
  }
  return;
}

Assistant:

void Converter::Impl::get_shader_model(const llvm::Module &module, String *model, uint32_t *major, uint32_t *minor)
{
	auto *resource_meta = module.getNamedMetadata("dx.shaderModel");
	if (!resource_meta)
	{
		if (major)
			*major = 6;
		if (minor)
			*minor = 0;
		if (model)
			model->clear();
	}
	else
	{
		auto *meta = resource_meta->getOperand(0);

		if (model)
			*model = get_string_metadata(meta, 0);
		if (major)
			*major = get_constant_metadata(meta, 1);
		if (minor)
			*minor = get_constant_metadata(meta, 2);
	}
}